

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzBuffToBuffDecompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int small,int verbosity)

{
  uint uVar1;
  int iVar2;
  bz_stream local_78;
  
  iVar2 = -2;
  if ((source != (char *)0x0 && (destLen != (uint *)0x0 && dest != (char *)0x0)) &&
     ((uint)verbosity < 5 && (uint)small < 2)) {
    local_78.bzalloc = (_func_void_ptr_void_ptr_int_int *)0x0;
    local_78.bzfree = (_func_void_void_ptr_void_ptr *)0x0;
    local_78.opaque = (void *)0x0;
    iVar2 = BZ2_bzDecompressInit(&local_78,verbosity,small);
    if (iVar2 == 0) {
      local_78.avail_out = *destLen;
      local_78.next_in = source;
      local_78.avail_in = sourceLen;
      local_78.next_out = dest;
      iVar2 = BZ2_bzDecompress(&local_78);
      uVar1 = local_78.avail_out;
      if (iVar2 == 0) {
        BZ2_bzDecompressEnd(&local_78);
        iVar2 = -7 - (uint)(uVar1 == 0);
      }
      else if (iVar2 == 4) {
        *destLen = *destLen - local_78.avail_out;
        BZ2_bzDecompressEnd(&local_78);
        iVar2 = 0;
      }
      else {
        BZ2_bzDecompressEnd(&local_78);
      }
    }
  }
  return iVar2;
}

Assistant:

int BZ_API(BZ2_bzBuffToBuffDecompress) 
                           ( char*         dest, 
                             unsigned int* destLen,
                             char*         source, 
                             unsigned int  sourceLen,
                             int           small,
                             int           verbosity )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL || 
       source == NULL ||
       (small != 0 && small != 1) ||
       verbosity < 0 || verbosity > 4) 
          return BZ_PARAM_ERROR;

   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzDecompressInit ( &strm, verbosity, small );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzDecompress ( &strm );
   if (ret == BZ_OK) goto output_overflow_or_eof;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;
   BZ2_bzDecompressEnd ( &strm );
   return BZ_OK;

   output_overflow_or_eof:
   if (strm.avail_out > 0) {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_UNEXPECTED_EOF;
   } else {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_OUTBUFF_FULL;
   };      

   errhandler:
   BZ2_bzDecompressEnd ( &strm );
   return ret; 
}